

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

char * duckdb_snappy::internal::CompressFragment
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size)

{
  short sVar1;
  uint32_t mask_00;
  uint32_t uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint16_t *puVar6;
  uint16_t *in_RCX;
  char *ptr;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  int in_R8D;
  pair<unsigned_long,_bool> pVar7;
  uint16_t *table_entry_2;
  size_t offset;
  size_t matched;
  pair<unsigned_long,_bool> p;
  char *base;
  char *next_ip;
  uint32_t bytes_between_hash_lookups;
  uint16_t *table_entry_1;
  uint16_t *table_entry;
  uint32_t dword;
  int i;
  int k;
  int j;
  long delta;
  char *candidate;
  uint32_t skip;
  uint64_t data;
  char *next_emit;
  uint32_t preload;
  char *ip_limit;
  size_t kInputMarginBytes;
  char *base_ip;
  char *ip_end;
  uint32_t mask;
  char *ip;
  undefined4 in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffeec;
  uint16_t *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  uint16_t in_stack_fffffffffffffefe;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  uint16_t *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  uint64_t *in_stack_ffffffffffffff58;
  uint16_t *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *local_80;
  uint local_74;
  uint64_t local_70;
  uint32_t local_5c;
  char *local_30;
  char *local_18;
  
  mask_00 = (in_R8D + -1) * 2;
  uVar2 = in_stack_ffffffffffffff00;
  pcVar5 = in_RDI;
  local_18 = in_RDX;
  if (0xe < in_RSI) {
    pcVar4 = in_RDI + (in_RSI - 0xf);
    local_5c = LittleEndian::Load32(in_RDI + 1);
    local_30 = in_RDI;
    do {
      pcVar5 = local_30;
      ptr = local_30 + 1;
      local_70 = LittleEndian::Load64(ptr);
      local_74 = 0x20;
      sVar1 = (short)in_RDI;
      uVar2 = in_stack_ffffffffffffff00;
      if (0xf < (long)pcVar4 - (long)ptr) {
        for (in_stack_ffffffffffffff74 = 0; in_stack_ffffffffffffff74 < 4;
            in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
          for (in_stack_ffffffffffffff70 = 0; in_stack_ffffffffffffff70 < 4;
              in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + 1) {
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff74 * 4 + in_stack_ffffffffffffff70;
            in_stack_ffffffffffffff04 = local_5c;
            if (in_stack_ffffffffffffff6c != 0) {
              in_stack_ffffffffffffff04 = (uint32_t)local_70;
            }
            in_stack_ffffffffffffff68 = in_stack_ffffffffffffff04;
            in_stack_ffffffffffffff60 =
                 anon_unknown_3::TableEntry(in_RCX,in_stack_ffffffffffffff04,mask_00);
            local_80 = in_RDI + (int)(uint)*in_stack_ffffffffffffff60;
            *in_stack_ffffffffffffff60 = ((short)ptr - sVar1) + (short)in_stack_ffffffffffffff6c;
            uVar2 = LittleEndian::Load32(local_80);
            if (uVar2 == in_stack_ffffffffffffff68) {
              *local_18 = (char)(in_stack_ffffffffffffff6c << 2);
              anon_unknown_3::UnalignedCopy128(local_30,local_18 + 1);
              local_30 = ptr + in_stack_ffffffffffffff6c;
              goto LAB_0073e9ac;
            }
            local_70 = local_70 >> 8;
          }
          local_70 = LittleEndian::Load64(ptr + (long)(in_stack_ffffffffffffff74 << 2) + 4);
        }
        local_74 = 0x30;
        uVar2 = in_stack_ffffffffffffff00;
        ptr = local_30 + 0x11;
      }
      while( true ) {
        local_30 = ptr;
        in_stack_ffffffffffffff00 = (uint32_t)local_70;
        in_stack_ffffffffffffff58 =
             (uint64_t *)anon_unknown_3::TableEntry(in_RCX,in_stack_ffffffffffffff00,mask_00);
        uVar3 = local_74 >> 5;
        local_74 = uVar3 + local_74;
        ptr = local_30 + uVar3;
        if (pcVar4 < ptr) goto LAB_0073eb8c;
        local_80 = in_RDI + (int)(uint)(ushort)*in_stack_ffffffffffffff58;
        *(short *)in_stack_ffffffffffffff58 = (short)local_30 - sVar1;
        uVar2 = LittleEndian::Load32(local_80);
        if (in_stack_ffffffffffffff00 == uVar2) break;
        uVar2 = LittleEndian::Load32(ptr);
        local_70 = (uint64_t)uVar2;
        uVar2 = in_stack_ffffffffffffff00;
      }
      EmitLiteral<true>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
LAB_0073e9ac:
      do {
        pVar7 = FindMatchLength((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),
                                (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ),(char *)in_stack_ffffffffffffff60,
                                in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff18 = (char *)(pVar7.first + 4);
        pcVar5 = in_stack_ffffffffffffff18 + (long)local_30;
        in_stack_ffffffffffffff10 = local_30 + -(long)local_80;
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_18 = EmitCopy<false>((char *)in_stack_fffffffffffffef0,
                                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                     0x73ea78);
        }
        else {
          local_18 = EmitCopy<true>((char *)in_stack_fffffffffffffef0,
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                    0x73ea57);
        }
        uVar2 = in_stack_ffffffffffffff00;
        if (pcVar4 <= pcVar5) goto LAB_0073eb8c;
        in_stack_fffffffffffffefe = ((short)pcVar5 - sVar1) - 1;
        in_stack_fffffffffffffef0 = in_RCX;
        uVar2 = LittleEndian::Load32(pcVar5 + -1);
        puVar6 = anon_unknown_3::TableEntry(in_stack_fffffffffffffef0,uVar2,mask_00);
        *puVar6 = in_stack_fffffffffffffefe;
        in_stack_fffffffffffffeec = (uint32_t)local_70;
        in_stack_ffffffffffffff08 =
             anon_unknown_3::TableEntry(in_RCX,in_stack_fffffffffffffeec,mask_00);
        local_80 = in_RDI + (int)(uint)*in_stack_ffffffffffffff08;
        *in_stack_ffffffffffffff08 = (short)pcVar5 - sVar1;
        uVar2 = LittleEndian::Load32(local_80);
        local_30 = pcVar5;
      } while (in_stack_fffffffffffffeec == uVar2);
      local_5c = (uint32_t)(local_70 >> 8);
    } while( true );
  }
LAB_0073eb8c:
  local_30 = pcVar5;
  if (local_30 < in_RDI + in_RSI) {
    local_18 = EmitLiteral<false>((char *)CONCAT44(in_stack_ffffffffffffff04,uVar2),
                                  (char *)CONCAT26(in_stack_fffffffffffffefe,
                                                   in_stack_fffffffffffffef8),
                                  (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  }
  return local_18;
}

Assistant:

char* CompressFragment(const char* input, size_t input_size, char* op,
                       uint16_t* table, const int table_size) {
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (uint32_t preload = LittleEndian::Load32(ip + 1);;) {
      // Bytes in [next_emit, ip) will be emitted as literal bytes.  Or
      // [next_emit, ip_end) after the main loop.
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      // The body of this loop calls EmitLiteral once and then EmitCopy one or
      // more times.  (The exception is that when we're close to exhausting
      // the input we goto emit_remainder.)
      //
      // In the first iteration of this loop we're just starting, so
      // there's nothing to copy, so calling EmitLiteral once is
      // necessary.  And we only start a new iteration when the
      // current iteration has determined that a call to EmitLiteral will
      // precede the next call to EmitCopy (if any).
      //
      // Step 1: Scan forward in the input looking for a 4-byte-long match.
      // If we get close to exhausting the input then goto emit_remainder.
      //
      // Heuristic match skipping: If 32 bytes are scanned with no matches
      // found, start looking only at every other byte. If 32 more bytes are
      // scanned (or skipped), look at every third byte, etc.. When a match is
      // found, immediately go back to looking at every byte. This is a small
      // loss (~5% performance, ~0.1% density) for compressible data due to more
      // bookkeeping, but for non-compressible data (such as JPEG) it's a huge
      // win since the compressor quickly "realizes" the data is incompressible
      // and doesn't bother looking for matches everywhere.
      //
      // The "skip" variable keeps track of how many bytes there are since the
      // last match; dividing it by 32 (ie. right-shifting by five) gives the
      // number of bytes to move ahead for each iteration.
      uint32_t skip = 32;

      const char* candidate;
      if (ip_limit - ip >= 16) {
        auto delta = ip - base_ip;
        for (int j = 0; j < 4; ++j) {
          for (int k = 0; k < 4; ++k) {
            int i = 4 * j + k;
            // These for-loops are meant to be unrolled. So we can freely
            // special case the first iteration to use the value already
            // loaded in preload.
            uint32_t dword = i == 0 ? preload : static_cast<uint32_t>(data);
            assert(dword == LittleEndian::Load32(ip + i));
            uint16_t* table_entry = TableEntry(table, dword, mask);
            candidate = base_ip + *table_entry;
            assert(candidate >= base_ip);
            assert(candidate < ip + i);
            *table_entry = delta + i;
            if (SNAPPY_PREDICT_FALSE(LittleEndian::Load32(candidate) == dword)) {
              *op = LITERAL | (i << 2);
              UnalignedCopy128(next_emit, op + 1);
              ip += i;
              op = op + i + 2;
              goto emit_match;
            }
            data >>= 8;
          }
          data = LittleEndian::Load64(ip + 4 * j + 4);
        }
        ip += 16;
        skip += 16;
      }
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry = TableEntry(table, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 5;
        skip += bytes_between_hash_lookups;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          break;
        }
        data = LittleEndian::Load32(next_ip);
        ip = next_ip;
      }

      // Step 2: A 4-byte match has been found.  We'll later see if more
      // than 4 bytes match.  But, prior to the match, input
      // bytes [next_emit, ip) are unmatched.  Emit them as "literal bytes."
      assert(next_emit + 16 <= ip_end);
      op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit, ip - next_emit);

      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
    emit_match:
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        std::pair<size_t, bool> p =
            FindMatchLength(candidate + 4, ip + 4, ip_end, &data);
        size_t matched = 4 + p.first;
        ip += matched;
        size_t offset = base - candidate;
        assert(0 == memcmp(base, candidate, matched));
        if (p.second) {
          op = EmitCopy</*len_less_than_12=*/true>(op, offset, matched);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset, matched);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // Expect 5 bytes to match
        assert((data & 0xFFFFFFFFFF) ==
               (LittleEndian::Load64(ip) & 0xFFFFFFFFFF));
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that.  To improve compression,
        // we also update table[Hash(ip - 1, mask)] and table[Hash(ip, mask)].
        *TableEntry(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;
        uint16_t* table_entry = TableEntry(table, data, mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        // Measurements on the benchmarks have shown the following probabilities
        // for the loop to exit (ie. avg. number of iterations is reciprocal).
        // BM_Flat/6  txt1    p = 0.3-0.4
        // BM_Flat/7  txt2    p = 0.35
        // BM_Flat/8  txt3    p = 0.3-0.4
        // BM_Flat/9  txt3    p = 0.34-0.4
        // BM_Flat/10 pb      p = 0.4
        // BM_Flat/11 gaviota p = 0.1
        // BM_Flat/12 cp      p = 0.5
        // BM_Flat/13 c       p = 0.3
      } while (static_cast<uint32_t>(data) == LittleEndian::Load32(candidate));
      // Because the least significant 5 bytes matched, we can utilize data
      // for the next iteration.
      preload = data >> 8;
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}